

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

bool anon_unknown.dwarf_1a3010::IsLoad(VmInstructionType cmd)

{
  VmInstructionType cmd_local;
  
  return cmd < VM_INST_LOAD_IMMEDIATE;
}

Assistant:

bool IsLoad(VmInstructionType cmd)
	{
		switch(cmd)
		{
		case VM_INST_LOAD_BYTE:
		case VM_INST_LOAD_SHORT:
		case VM_INST_LOAD_INT:
		case VM_INST_LOAD_FLOAT:
		case VM_INST_LOAD_DOUBLE:
		case VM_INST_LOAD_LONG:
		case VM_INST_LOAD_STRUCT:
			return true;
		default:
			break;
		}

		// Note: memory read can be performed by references in VM_INST_RETURN and VM_INST_CALL instructions
		// Note: memory read can be performed from source argument of VM_INST_MEM_COPY instruction

		return false;
	}